

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O3

Status __thiscall
google::protobuf::anon_unknown_21::ValidateDescriptor(anon_unknown_21 *this,Descriptor *descriptor)

{
  void **ppvVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  FieldOptions *pFVar5;
  EnumValueDescriptor *pEVar6;
  long lVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  uintptr_t in_RAX;
  Status SVar11;
  EnumDescriptor *pEVar12;
  uintptr_t extraout_RAX;
  Rep *pRVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  Edition args_3;
  char *pcVar18;
  char *in_R9;
  FieldDescriptor *this_00;
  long lVar19;
  long lVar20;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar21;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar22;
  FieldOptions_FeatureSupport *p;
  undefined1 *puVar23;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  string_view full_name;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  string_view full_name_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  basic_string_view<char,_std::char_traits<char>_> args_1_03;
  basic_string_view<char,_std::char_traits<char>_> args_3_00;
  FieldOptions_FeatureSupport *local_80;
  FieldOptions_FeatureSupport local_60;
  
  if (0 < descriptor->oneof_decl_count_) {
    pcVar14 = (descriptor->all_names_).payload_;
    uVar3 = *(ushort *)(pcVar14 + 2);
    args_1._M_str._0_2_ = uVar3;
    args_1._M_len = (size_t)"Type ";
    args_1._M_str._2_6_ = 0;
    SVar11 = protobuf::(anonymous_namespace)::
             Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                       ((char *)this,args_1,pcVar14 + ~(ulong)uVar3);
    return (Status)SVar11.rep_;
  }
  if (0 < descriptor->field_count_) {
    lVar20 = 0;
    do {
      this_00 = descriptor->fields_ + lVar20;
      bVar9 = FieldDescriptor::is_required(this_00);
      if (bVar9) {
        pcVar14 = (this_00->all_names_).payload_;
        pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
        goto LAB_00290534;
      }
      bVar2 = this_00->field_0x1;
      if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
LAB_00290555:
        _GLOBAL__N_1::ValidateDescriptor();
        goto LAB_0029056a;
      }
      if ((bVar2 & 0x20) != 0) {
        pcVar14 = (this_00->all_names_).payload_;
        pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
        goto LAB_00290534;
      }
      if ((this_00->type_ != '\b') && (this_00->type_ != '\x0e')) {
        pcVar14 = (this_00->all_names_).payload_;
        pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
        goto LAB_00290534;
      }
      iVar10 = internal::SooRep::size
                         (&(this_00->options_->field_0)._impl_.targets_.soo_rep_,
                          (*(byte *)((long)&this_00->options_->field_0 + 0x20) & 4) == 0);
      if (iVar10 == 0) {
        pcVar14 = (this_00->all_names_).payload_;
        pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
        goto LAB_00290534;
      }
      pFVar5 = this_00->options_;
      pRVar21 = &(pFVar5->field_0)._impl_.edition_defaults_;
      pRVar22 = pRVar21;
      if ((*(byte *)((long)&pFVar5->field_0 + 0x30) & 1) != 0) {
        pRVar13 = internal::RepeatedPtrFieldBase::rep(&pRVar21->super_RepeatedPtrFieldBase);
        pRVar22 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                  pRVar13->elements;
        if (((ulong)(pRVar21->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar13 = internal::RepeatedPtrFieldBase::rep(&pRVar21->super_RepeatedPtrFieldBase);
          pRVar21 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                    pRVar13->elements;
        }
      }
      ppvVar1 = &(pRVar21->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                *(int *)((long)&pFVar5->field_0 + 0x38);
      if (pRVar22 == (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)ppvVar1) {
LAB_00290482:
        pcVar14 = (this_00->all_names_).payload_;
        pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
LAB_00290534:
        args_1_03._M_str = pcVar15;
        args_1_03._M_len = (size_t)"Feature field ";
        SVar11 = protobuf::(anonymous_namespace)::
                 Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                           ((char *)this,args_1_03,pcVar14);
        return (Status)SVar11.rep_;
      }
      bVar2 = 0;
      do {
        bVar8 = bVar2;
        bVar9 = *(int *)((long)(pRVar22->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + 0x20) ==
                900;
        pRVar22 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                  &(pRVar22->super_RepeatedPtrFieldBase).current_size_;
        bVar2 = bVar8 | bVar9;
      } while (pRVar22 != (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)ppvVar1
              );
      if (!(bool)(bVar8 | bVar9)) goto LAB_00290482;
      uVar4 = (this_00->options_->field_0)._impl_._has_bits_.has_bits_[0];
      puVar23 = (undefined1 *)(this_00->options_->field_0)._impl_.feature_support_;
      if (((FieldOptions_FeatureSupport *)puVar23 == (FieldOptions_FeatureSupport *)0x0 &
          (byte)uVar4 >> 1) == 1) {
        internal::protobuf_assumption_failed
                  ("!value || _impl_.feature_support_ != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                   ,0x49b9);
      }
      if ((uVar4 & 2) == 0) {
        pcVar14 = (this_00->all_names_).payload_;
        pcVar15 = (char *)(ulong)*(ushort *)(pcVar14 + 2);
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
LAB_0029018b:
        args_1_00._M_str = pcVar15;
        args_1_00._M_len = (size_t)"Feature field ";
        SVar11 = protobuf::(anonymous_namespace)::
                 Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                           ((char *)this,args_1_00,pcVar14);
LAB_00290190:
        if (*(long *)this != 1) {
          return (Status)SVar11.rep_;
        }
      }
      else {
        if ((FieldOptions_FeatureSupport *)puVar23 == (FieldOptions_FeatureSupport *)0x0) {
          puVar23 = _FieldOptions_FeatureSupport_default_instance_;
        }
        pcVar14 = (this_00->all_names_).payload_;
        uVar3 = *(ushort *)(pcVar14 + 2);
        pcVar15 = (char *)(ulong)uVar3;
        pcVar14 = pcVar14 + ~(ulong)pcVar15;
        if ((undefined1  [32])
            ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar23)->field_0 &
            (undefined1  [32])0x2) == (undefined1  [32])0x0) goto LAB_0029018b;
        full_name_00._M_str._0_2_ = uVar3;
        full_name_00._M_len = (size_t)puVar23;
        full_name_00._M_str._2_6_ = 0;
        SVar11 = ValidateFeatureSupport((FeatureSupport *)this,full_name_00);
        if (*(long *)this != 1) {
          return (Status)SVar11.rep_;
        }
        pFVar5 = this_00->options_;
        pRVar21 = &(pFVar5->field_0)._impl_.edition_defaults_;
        pRVar22 = pRVar21;
        if ((*(byte *)((long)&pFVar5->field_0 + 0x30) & 1) != 0) {
          pRVar13 = internal::RepeatedPtrFieldBase::rep(&pRVar21->super_RepeatedPtrFieldBase);
          pRVar22 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                    pRVar13->elements;
          if (((ulong)(pRVar21->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
            pRVar13 = internal::RepeatedPtrFieldBase::rep(&pRVar21->super_RepeatedPtrFieldBase);
            pRVar21 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                      pRVar13->elements;
          }
        }
        for (; pRVar22 !=
               (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
               (&(pRVar21->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
               *(int *)((long)&pFVar5->field_0 + 0x38));
            pRVar22 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                      &(pRVar22->super_RepeatedPtrFieldBase).current_size_) {
          uVar4 = *(uint *)((long)(pRVar22->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + 0x20);
          if (999 < (int)uVar4) {
            if ((int)uVar4 <
                (((FieldOptions_FeatureSupport *)puVar23)->field_0)._impl_.edition_introduced_) {
              pcVar14 = (this_00->all_names_).payload_;
              uVar17 = (ulong)*(ushort *)(pcVar14 + 2);
              pcVar14 = pcVar14 + ~uVar17;
              args_3 = 0x45feaa;
            }
            else {
              if (((undefined1  [32])
                   ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar23)->field_0 &
                   (undefined1  [32])0x8) == (undefined1  [32])0x0) ||
                 ((int)uVar4 <=
                  (((FieldOptions_FeatureSupport *)puVar23)->field_0)._impl_.edition_removed_))
              goto LAB_00290414;
              pcVar14 = (this_00->all_names_).payload_;
              uVar17 = (ulong)*(ushort *)(pcVar14 + 2);
              pcVar14 = pcVar14 + ~uVar17;
              args_3 = 0x45ff43;
            }
            args_1_02._M_str = pcVar14;
            args_1_02._M_len = uVar17;
            SVar11 = protobuf::(anonymous_namespace)::
                     Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,google::protobuf::Edition,char_const*>
                               ((char *)this,args_1_02,(char *)(ulong)uVar4,args_3,in_R9);
            goto LAB_00290190;
          }
LAB_00290414:
        }
        *(undefined8 *)this = 1;
      }
      pEVar12 = FieldDescriptor::enum_type(this_00);
      if (pEVar12 != (EnumDescriptor *)0x0) {
        pEVar12 = FieldDescriptor::enum_type(this_00);
        if (pEVar12 == (EnumDescriptor *)0x0) {
LAB_0029056a:
          _GLOBAL__N_1::ValidateDescriptor((_GLOBAL__N_1 *)&local_60);
LAB_00290574:
          internal::protobuf_assumption_failed
                    ("!value || _impl_.feature_support_ != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                     ,0x4c6f);
        }
        local_80 = (this_00->options_->field_0)._impl_.feature_support_;
        if (local_80 == (FieldOptions_FeatureSupport *)0x0) {
          local_80 = (FieldOptions_FeatureSupport *)_FieldOptions_FeatureSupport_default_instance_;
        }
        pEVar12 = FieldDescriptor::enum_type(this_00);
        if (0 < pEVar12->value_count_) {
          lVar16 = 0x18;
          lVar19 = 0;
          do {
            pEVar12 = FieldDescriptor::enum_type(this_00);
            if (pEVar12->value_count_ <= lVar19) {
              _GLOBAL__N_1::ValidateDescriptor();
              goto LAB_00290555;
            }
            pEVar6 = pEVar12->values_;
            pcVar14 = (this_00->all_names_).payload_;
            uVar3 = *(ushort *)(pcVar14 + 2);
            pcVar15 = (char *)(ulong)uVar3;
            uVar4 = *(uint *)(*(long *)(&pEVar6->super_SymbolBaseN<0> + lVar16) + 0x28);
            if (((uVar4 & 2) != 0) &&
               (*(long *)(*(long *)(&pEVar6->super_SymbolBaseN<0> + lVar16) + 0x50) == 0))
            goto LAB_00290574;
            if ((uVar4 & 2) == 0) {
              *(undefined8 *)this = 1;
            }
            else {
              FieldOptions_FeatureSupport::FieldOptions_FeatureSupport
                        (&local_60,(Arena *)0x0,local_80);
              puVar23 = *(undefined1 **)(*(long *)(&pEVar6->super_SymbolBaseN<0> + lVar16) + 0x50);
              if ((MessageLite *)puVar23 == (MessageLite *)0x0) {
                puVar23 = _FieldOptions_FeatureSupport_default_instance_;
              }
              FieldOptions_FeatureSupport::MergeImpl
                        ((MessageLite *)&local_60,(MessageLite *)puVar23);
              full_name._M_str = *(char **)(*(long *)((long)pEVar6 + lVar16 + -0x10) + 0x28);
              full_name._M_len = (size_t)&local_60;
              ValidateFeatureSupport((FeatureSupport *)this,full_name);
              if (*(long *)this == 1) {
                pcVar18 = " was introduced before feature ";
                if (((local_60.field_0._impl_.edition_introduced_ <
                      (local_80->field_0)._impl_.edition_introduced_) ||
                    ((((undefined1  [32])local_80->field_0 & (undefined1  [32])0x8) !=
                      (undefined1  [32])0x0 &&
                     (pcVar18 = " was removed after feature ",
                     (local_80->field_0)._impl_.edition_removed_ <
                     local_60.field_0._impl_.edition_removed_)))) ||
                   ((((undefined1  [32])local_80->field_0 & (undefined1  [32])0x4) !=
                     (undefined1  [32])0x0 &&
                    (pcVar18 = " was deprecated after feature ",
                    (local_80->field_0)._impl_.edition_deprecated_ <
                    local_60.field_0._impl_.edition_deprecated_)))) {
                  lVar7 = *(long *)((long)pEVar6 + lVar16 + -0x10);
                  args_1_01._M_str = *(char **)(lVar7 + 0x28);
                  args_1_01._M_len = (size_t)"Feature value ";
                  args_3_00._M_str._0_2_ = uVar3;
                  args_3_00._M_len = (size_t)pcVar18;
                  args_3_00._M_str._2_6_ = 0;
                  protobuf::(anonymous_namespace)::
                  Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                            ((char *)this,args_1_01,*(char **)(lVar7 + 0x20),args_3_00,
                             pcVar14 + ~(ulong)pcVar15);
                  in_R9 = pcVar15;
                }
                else {
                  *(undefined8 *)this = 1;
                }
              }
              FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(&local_60);
              if (*(long *)this != 1) {
                return (Status)extraout_RAX;
              }
            }
            lVar19 = lVar19 + 1;
            pEVar12 = FieldDescriptor::enum_type(this_00);
            lVar16 = lVar16 + 0x30;
          } while (lVar19 < pEVar12->value_count_);
        }
        *(undefined8 *)this = 1;
      }
      lVar20 = lVar20 + 1;
      in_RAX = (uintptr_t)descriptor->field_count_;
    } while (lVar20 < (long)in_RAX);
  }
  *(undefined8 *)this = 1;
  return (Status)in_RAX;
}

Assistant:

absl::Status ValidateDescriptor(const Descriptor& descriptor) {
  if (descriptor.oneof_decl_count() > 0) {
    return Error("Type ", descriptor.full_name(),
                 " contains unsupported oneof feature fields.");
  }
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);

    if (field.is_required()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported required field.");
    }
    if (field.is_repeated()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported repeated field.");
    }
    if (field.type() != FieldDescriptor::TYPE_ENUM &&
        field.type() != FieldDescriptor::TYPE_BOOL) {
      return Error("Feature field ", field.full_name(),
                   " is not an enum or boolean.");
    }
    if (field.options().targets().empty()) {
      return Error("Feature field ", field.full_name(),
                   " has no target specified.");
    }

    bool has_legacy_default = false;
    for (const auto& d : field.options().edition_defaults()) {
      if (d.edition() == Edition::EDITION_LEGACY) {
        has_legacy_default = true;
        continue;
      }
    }
    if (!has_legacy_default) {
      return Error("Feature field ", field.full_name(),
                   " has no default specified for EDITION_LEGACY, before it "
                   "was introduced.");
    }

    RETURN_IF_ERROR(ValidateFieldFeatureSupport(field));
    if (field.enum_type() != nullptr) {
      RETURN_IF_ERROR(ValidateValuesFeatureSupport(field));
    }
  }

  return absl::OkStatus();
}